

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O0

void __thiscall DMovingFloor::DMovingFloor(DMovingFloor *this,sector_t_conflict *sector)

{
  DInterpolation *q;
  sector_t_conflict *sector_local;
  DMovingFloor *this_local;
  
  DMover::DMover(&this->super_DMover,sector);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f48a8;
  TObjPtr<DSectorEffect>::operator=(&sector->floordata,(DSectorEffect *)this);
  q = sector_t::SetInterpolation((sector_t *)sector,1,true);
  TObjPtr<DInterpolation>::operator=(&(this->super_DMover).interpolation,q);
  return;
}

Assistant:

DMovingFloor::DMovingFloor (sector_t *sector)
	: DMover (sector)
{
	sector->floordata = this;
	interpolation = sector->SetInterpolation(sector_t::FloorMove, true);
}